

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::destroy_range
               (NameIndex *S,NameIndex *E)

{
  NameIndex *local_18;
  NameIndex *E_local;
  NameIndex *S_local;
  
  local_18 = E;
  while (S != local_18) {
    local_18 = local_18 + -1;
    DWARFDebugNames::NameIndex::~NameIndex(local_18);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }